

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv.cc
# Opt level: O1

from_chars_result
absl::from_chars(Nonnull<const_char_*> first,Nonnull<const_char_*> last,float *value,
                chars_format fmt)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  byte bVar9;
  undefined1 auVar10 [16];
  bool bVar11;
  ulong uVar12;
  uint64_t guess_mantissa;
  byte bVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  uint64_t uVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  Nonnull<const_char_*> begin;
  bool negative;
  float fVar24;
  CalculatedFloat CVar25;
  from_chars_result fVar26;
  uint128 value_00;
  from_chars_result result;
  ParsedFloat hex_parse;
  from_chars_result local_78;
  ParsedFloat local_68;
  CalculatedFloat local_38;
  
  local_78.ec = 0;
  negative = false;
  begin = first;
  if (first != last) {
    negative = *first == '-';
    begin = first + negative;
  }
  local_78.ptr = first;
  if (((((fmt & hex) == 0) && (1 < (long)last - (long)begin)) && (*begin == '0')) &&
     ((byte)(begin[1] | 0x20U) == 0x78)) {
    strings_internal::ParseFloat<16>(&local_68,begin + 2,last,fmt);
    if ((local_68.end != (Nonnull<const_char_*>)0x0) && (local_68.type == kNumber)) {
LAB_00273914:
      local_78.ptr = local_68.end;
      bVar11 = anon_unknown_0::HandleEdgeCase<float>(&local_68,negative,value);
      if (bVar11) goto LAB_00273cc0;
      CVar25 = anon_unknown_0::CalculateFromParsedHexadecimal<float>(&local_68);
      local_38.mantissa = CVar25.mantissa;
      local_38.exponent = CVar25.exponent;
LAB_00273cb3:
      anon_unknown_0::EncodeResult<float>(&local_38,negative,&local_78,value);
      goto LAB_00273cc0;
    }
    if (fmt != scientific) {
      local_78.ptr = begin + 1;
      if (negative == false) {
        fVar24 = 0.0;
      }
      else {
        fVar24 = -0.0;
      }
      *value = fVar24;
      goto LAB_00273cc0;
    }
  }
  else if ((fmt & hex) == 0) {
    strings_internal::ParseFloat<10>(&local_68,begin,last,fmt);
    if (local_68.end != (Nonnull<const_char_*>)0x0) {
      local_78.ptr = local_68.end;
      bVar11 = anon_unknown_0::HandleEdgeCase<float>(&local_68,negative,value);
      if (bVar11) goto LAB_00273cc0;
      if ((Nonnull<bool_*>)local_68.subrange_begin == (Nonnull<bool_*>)0x0) {
        if (local_68.exponent < -0x40) {
          if (negative == false) {
            fVar24 = 0.0;
          }
          else {
            fVar24 = -0.0;
          }
        }
        else {
          if (local_68.exponent < 0x27) {
            if (local_68.mantissa == 0) {
              uVar20 = 0x40;
            }
            else {
              lVar15 = 0x3f;
              if (local_68.mantissa != 0) {
                for (; local_68.mantissa >> lVar15 == 0; lVar15 = lVar15 + -1) {
                }
              }
              uVar20 = (uint)lVar15 ^ 0x3f;
            }
            uVar12 = local_68.mantissa << ((byte)uVar20 & 0x3f);
            auVar3._8_8_ = 0;
            auVar3._0_8_ = uVar12;
            auVar6._8_8_ = 0;
            auVar6._0_8_ = *(ulong *)((anonymous_namespace)::kPower10MantissaHighTable +
                                     (ulong)(local_68.exponent + 0x156) * 8);
            auVar3 = auVar3 * auVar6;
            if (CARRY8(auVar3._0_8_,uVar12) && (~auVar3._8_8_ & 0x3fffffffff) == 0) {
              auVar4._8_8_ = 0;
              auVar4._0_8_ = uVar12;
              auVar7._8_8_ = 0;
              auVar7._0_8_ = *(ulong *)((anonymous_namespace)::kPower10MantissaLowTable +
                                       (ulong)(local_68.exponent + 0x156) * 8);
              auVar10._8_8_ = 0;
              auVar10._0_8_ = SUB168(auVar4 * auVar7,8);
              auVar3 = auVar3 + auVar10;
              if (((CARRY8(SUB168(auVar4 * auVar7,0),uVar12)) && (auVar3._0_8_ == -1)) &&
                 ((auVar3._8_8_ & 0x3fffffffff) == 0x3fffffffff)) goto LAB_002738ec;
            }
            uVar12 = auVar3._8_8_ >> (0x26U - (auVar3[0xf] >> 7) & 0x3f);
            uVar14 = (uint)uVar12;
            if ((auVar3._0_8_ != 0) ||
               ((uVar14 & 3) != 1 ||
                (auVar3 & (undefined1  [16])0x3fffffffff) != (undefined1  [16])0x0)) {
              uVar12 = (uVar14 & 1) + uVar12;
              lVar15 = (((long)(int)(((local_68.exponent * 0x3526a >> 0x10) - uVar20) + 0xbf) -
                        (auVar3._8_8_ >> 0x3f ^ 1)) + 1) - (ulong)(uVar12 < 0x2000000);
              if (0xffffffffffffff01 < lVar15 - 0xffU) {
                uVar14 = (int)lVar15 * 0x800000;
                uVar20 = (uint)(uVar12 >> 1) & 0x7fffff;
                fVar24 = (float)(uVar20 + uVar14 + 0x80000000);
                if (negative == false) {
                  fVar24 = (float)(uVar14 | uVar20);
                }
                *value = fVar24;
                goto LAB_00273cc0;
              }
            }
            goto LAB_002738ec;
          }
          if (negative == false) {
            fVar24 = 3.4028235e+38;
          }
          else {
            fVar24 = -3.4028235e+38;
          }
        }
        *value = fVar24;
        local_78.ec = result_out_of_range;
        goto LAB_00273cc0;
      }
LAB_002738ec:
      if ((long)local_68.exponent < -0x156) {
        local_38.mantissa = 0;
        local_38.exponent = -99999;
      }
      else if (local_68.exponent < 0x135) {
        auVar2._8_8_ = 0;
        auVar2._0_8_ = *(ulong *)((anonymous_namespace)::kPower10MantissaHighTable +
                                 (long)local_68.exponent * 8 + 0xab0);
        auVar5._8_8_ = 0;
        auVar5._0_8_ = local_68.mantissa;
        auVar8 = auVar2 * auVar5;
        uVar16 = auVar8._8_8_;
        uVar12 = auVar8._0_8_;
        iVar23 = (local_68.exponent * 0x3526a >> 0x10) + -0x3f;
        if ((Nonnull<bool_*>)local_68.subrange_begin == (Nonnull<bool_*>)0x0) {
          if ((uint)local_68.exponent < 0x1c) {
            if (uVar16 == 0) {
              if (uVar12 == 0) {
                uVar20 = 0x40;
              }
              else {
                lVar15 = 0x3f;
                if (uVar12 != 0) {
                  for (; uVar12 >> lVar15 == 0; lVar15 = lVar15 + -1) {
                  }
                }
                uVar20 = (uint)lVar15 ^ 0x3f;
              }
              iVar21 = 0x40 - uVar20;
            }
            else {
              lVar15 = 0x3f;
              if (uVar16 != 0) {
                for (; uVar16 >> lVar15 == 0; lVar15 = lVar15 + -1) {
                }
              }
              iVar21 = ((uint)lVar15 ^ 0xffffffc0) + 0x81;
            }
            bVar13 = 1;
          }
          else {
            lVar15 = 0x3f;
            if (uVar16 != 0) {
              for (; uVar16 >> lVar15 == 0; lVar15 = lVar15 + -1) {
              }
            }
            if (uVar12 == 0) {
              uVar20 = 0x40;
            }
            else {
              lVar1 = 0x3f;
              if (uVar12 != 0) {
                for (; uVar12 >> lVar1 == 0; lVar1 = lVar1 + -1) {
                }
              }
              uVar20 = (uint)lVar1 ^ 0x3f;
            }
            uVar14 = (uint)lVar15 ^ 0x3f;
            if (uVar16 == 0) {
              uVar14 = uVar20;
            }
            iVar21 = (uint)(uVar16 != 0) * 0x40 - uVar14;
            uVar20 = iVar21 + 1;
            bVar13 = (byte)uVar20;
            bVar9 = bVar13 & 0x3f;
            uVar17 = uVar16 >> (bVar13 & 0x3f);
            bVar13 = 0;
            uVar18 = uVar17;
            uVar12 = uVar12 >> bVar9 | uVar16 << 0x40 - bVar9;
            if ((uVar20 & 0x40) != 0) {
              uVar18 = 0;
              uVar12 = uVar17;
            }
            auVar8._8_8_ = uVar18;
            auVar8._0_8_ = uVar12;
            iVar23 = iVar23 + iVar21 + 1;
            iVar21 = 0x3f;
          }
        }
        else {
          lVar15 = 0x3f;
          if (uVar16 != 0) {
            for (; uVar16 >> lVar15 == 0; lVar15 = lVar15 + -1) {
            }
          }
          if (uVar12 == 0) {
            uVar20 = 0x40;
          }
          else {
            lVar1 = 0x3f;
            if (uVar12 != 0) {
              for (; uVar12 >> lVar1 == 0; lVar1 = lVar1 + -1) {
              }
            }
            uVar20 = (uint)lVar1 ^ 0x3f;
          }
          uVar14 = (uint)lVar15 ^ 0x3f;
          if (uVar16 == 0) {
            uVar14 = uVar20;
          }
          iVar21 = (uint)(uVar16 != 0) * 0x40 - uVar14;
          uVar20 = iVar21 + 6;
          bVar13 = (byte)uVar20;
          bVar9 = bVar13 & 0x3f;
          uVar17 = uVar16 >> (bVar13 & 0x3f);
          bVar13 = 0;
          uVar18 = uVar17;
          uVar12 = uVar12 >> bVar9 | uVar16 << 0x40 - bVar9;
          if ((uVar20 & 0x40) != 0) {
            uVar18 = 0;
            uVar12 = uVar17;
          }
          auVar8._8_8_ = uVar18;
          auVar8._0_8_ = uVar12;
          iVar23 = iVar23 + iVar21 + 6;
          iVar21 = 0x3a;
        }
        iVar22 = -0x95 - iVar23;
        if (-0x95 - iVar23 < iVar21 + -0x18) {
          iVar22 = iVar21 + -0x18;
        }
        value_00.hi_._0_4_ = iVar22;
        value_00.lo_ = auVar8._8_8_;
        value_00.hi_._4_4_ = 0;
        guess_mantissa =
             anon_unknown_0::ShiftRightAndRound
                       (auVar8._0_8_,value_00,(uint)bVar13,SUB81(&local_38,0),
                        (Nonnull<bool_*>)local_68.subrange_begin);
        if ((char)local_38.mantissa == '\0') {
          bVar11 = anon_unknown_0::MustRoundUp(guess_mantissa,iVar23 + iVar22,&local_68);
          guess_mantissa = guess_mantissa + bVar11;
        }
        uVar19 = 0x800000;
        if (guess_mantissa != 0x1000000) {
          uVar19 = guess_mantissa;
        }
        iVar21 = iVar23 + iVar22 + (uint)(guess_mantissa == 0x1000000);
        iVar23 = -99999;
        if (uVar19 != 0) {
          iVar23 = iVar21;
        }
        local_38.mantissa = 0;
        local_38.exponent = 99999;
        if (iVar21 < 0x69) {
          local_38.mantissa = uVar19;
          local_38.exponent = iVar23;
        }
      }
      else {
        local_38.mantissa = 0;
        local_38.exponent = 99999;
      }
      goto LAB_00273cb3;
    }
  }
  else {
    strings_internal::ParseFloat<16>(&local_68,begin,last,fmt);
    if (local_68.end != (Nonnull<const_char_*>)0x0) goto LAB_00273914;
  }
  local_78.ec = invalid_argument;
LAB_00273cc0:
  fVar26.ec = local_78.ec;
  fVar26.ptr = local_78.ptr;
  fVar26._12_4_ = 0;
  return fVar26;
}

Assistant:

from_chars_result from_chars(absl::Nonnull<const char*> first,
                             absl::Nonnull<const char*> last, float& value,
                             chars_format fmt) {
  return FromCharsImpl(first, last, value, fmt);
}